

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O3

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common
          (LibraryEffectsLoader14 *this)

{
  _func_int **pp_Var1;
  int in_ESI;
  undefined4 uVar2;
  
  uVar2 = 0;
  if (in_ESI - 1U < 6) {
    uVar2 = *(undefined4 *)(&DAT_0083d7b0 + (ulong)(in_ESI - 1U) * 4);
  }
  pp_Var1 = (this->super_LibraryImagesLoader14).super_IParserImpl14.super_ColladaParserAutoGen14.
            _vptr_ColladaParserAutoGen14;
  (**(code **)(*pp_Var1 + 400))(pp_Var1,uVar2);
  return;
}

Assistant:

bool LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common( const COLLADASaxFWL14::ENUM__fx_sampler_wrap_common value )
{
SaxVirtualFunctionTest14(data__wrap_t____fx_sampler_wrap_common(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NONE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NONE; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_t____fx_sampler_wrap_common(newValue);
}